

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,DSVectorBase<double> *vec)

{
  if (this != vec) {
    (this->super_SVectorBase<double>).memused = 0;
    makeMem(this,(vec->super_SVectorBase<double>).memused);
    SVectorBase<double>::operator=(&this->super_SVectorBase<double>,&vec->super_SVectorBase<double>)
    ;
  }
  return this;
}

Assistant:

DSVectorBase<R>& operator=(const DSVectorBase<R>& vec)
   {
      if(this != &vec)
      {
         SVectorBase<R>::clear();
         makeMem(vec.size());
         SVectorBase<R>::operator=(vec);
      }

      return *this;
   }